

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerImpl::RegisterMulticastListener
          (CommissionerImpl *this,Handler<uint8_t> *aHandler,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aMulticastAddrList,uint32_t aTimeout)

{
  char cVar1;
  pointer pbVar2;
  type tVar3;
  int iVar4;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined1 auVar9 [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer aIp;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  Error error;
  Address multicastAddr;
  writer write;
  ByteArray rawAddresses;
  anon_class_32_1_d0c21527 onResponse;
  Request request;
  undefined1 local_238 [8];
  _Alloc_hider _Stack_230;
  undefined1 local_228 [24];
  parse_func local_210 [1];
  undefined1 local_200 [8];
  uchar *local_1f8;
  char local_1f0 [8];
  uchar local_1e8 [16];
  type local_1d8;
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  CommissionerImpl *local_1b0;
  string local_1a8;
  uint32_t local_17c;
  Address local_178;
  writer local_158;
  char *pcStack_150;
  ByteArray local_148;
  _Any_data *local_128;
  _Any_data local_120;
  code *local_110;
  _Any_data local_100;
  code *local_f0;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  char local_c8 [16];
  Message local_b8;
  
  local_1d0 = local_1c0;
  local_1d8 = none_type;
  local_1c8 = 0;
  local_1c0[0] = 0;
  local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0 = this;
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  local_128 = (_Any_data *)aHandler;
  std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::function
            ((function<void_(const_unsigned_char_*,_ot::commissioner::Error)> *)&local_100,aHandler)
  ;
  aIp = (aMulticastAddrList->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (aMulticastAddrList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (aIp != pbVar2) {
    local_17c = aTimeout;
LAB_00162959:
    Address::Set((Error *)local_238,&local_178,aIp);
    local_1d8 = local_238._0_4_;
    std::__cxx11::string::operator=((string *)&local_1d0,(string *)&_Stack_230);
    tVar3 = local_1d8;
    if (_Stack_230._M_p != local_228 + 8) {
      operator_delete(_Stack_230._M_p);
    }
    if (tVar3 == none_type) {
      if (((local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start) &&
          ((long)local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start == 0x10)) &&
         (*local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start == 0xff)) goto code_r0x001629cc;
      local_238._0_4_ = 0xd;
      pcVar5 = "{} is not a valid IPv6 multicast address";
      _Stack_230._M_p = "{} is not a valid IPv6 multicast address";
      local_228._0_8_ = 0x28;
      local_228._8_8_ = 0x100000000;
      local_210[0] = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_228._16_8_ = local_238;
      local_158.handler_ = (format_string_checker<char> *)local_238;
      do {
        cVar1 = *pcVar5;
        pcVar7 = pcVar5;
        while (cVar1 != '{') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&local_158,pcVar5,"");
            goto LAB_00162ee5;
          }
          cVar1 = *pcVar7;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&local_158,pcVar5,pcVar7);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar7,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_238);
      } while (pcVar5 != "");
LAB_00162ee5:
      Address::ToString_abi_cxx11_((string *)local_238,&local_178);
      local_158.handler_ = (format_string_checker<char> *)local_238;
      pcStack_150 = _Stack_230._M_p;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x28;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_158;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1a8,(v10 *)"{} is not a valid IPv6 multicast address",fmt,args_01);
      local_200._0_4_ = 2;
      local_1f8 = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      local_1d8 = local_200._0_4_;
      std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_1f8);
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_228;
      goto LAB_00162f92;
    }
    goto LAB_00162fa0;
  }
  local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
  pcVar5 = "Multicast Address List cannot be empty";
  _Stack_230._M_p = "Multicast Address List cannot be empty";
  local_228._0_8_ = 0x26;
  local_228._8_8_ = 0;
  local_210[0] = (parse_func)0x0;
  local_228._16_8_ = local_238;
  local_158.handler_ = (format_string_checker<char> *)local_238;
  do {
    cVar1 = *pcVar5;
    pcVar7 = pcVar5;
    while (cVar1 != '{') {
      pcVar7 = pcVar7 + 1;
      if (pcVar7 == "") {
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_158,pcVar5,"");
        goto LAB_00162dbe;
      }
      cVar1 = *pcVar7;
    }
    ::fmt::v10::detail::
    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
    operator()(&local_158,pcVar5,pcVar7);
    pcVar5 = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (pcVar7,"",(format_string_checker<char> *)local_238);
  } while (pcVar5 != "");
LAB_00162dbe:
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)local_238;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_1a8,(v10 *)"Multicast Address List cannot be empty",(string_view)ZEXT816(0x26),
             args_00);
  local_200._0_4_ = 2;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_1a8._M_dataplus._M_p,
             local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
LAB_00162e0c:
  local_1d8 = local_200._0_4_;
  std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_1f8);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  paVar6 = &local_1a8.field_2;
LAB_00162f92:
  auVar9 = (undefined1  [8])(((string *)(paVar6 + -1))->_M_dataplus)._M_p;
  if (auVar9 == (undefined1  [8])paVar6) goto LAB_00162fa0;
LAB_00162f9b:
  operator_delete((void *)auVar9);
LAB_00162fa0:
  if (local_1d8 != none_type) {
    local_e0._0_4_ = local_1d8;
    local_d8._M_p = local_c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_1d0,local_1d0 + local_1c8);
    local_238 = (undefined1  [8])0x0;
    if (*(long *)(local_128 + 1) == 0) {
      uVar8 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar8);
    }
    (**(code **)((long)local_128 + 0x18))(local_128,(uchar **)local_238,(Error *)local_e0);
    if (local_d8._M_p != local_c8) {
      operator_delete(local_d8._M_p);
    }
  }
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  return;
code_r0x001629cc:
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,
             local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  aIp = aIp + 1;
  if (aIp == pbVar2) goto code_r0x001629e9;
  goto LAB_00162959;
code_r0x001629e9:
  iVar4 = (*(local_1b0->super_Commissioner)._vptr_Commissioner[9])();
  if ((char)iVar4 == '\0') {
    local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
    _Stack_230._M_p = "the commissioner is not active";
    local_228._0_8_ = 0x1e;
    local_228._8_8_ = 0;
    local_210[0] = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_228._16_8_ = local_238;
    do {
      pcVar7 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar7 == "") || (*pcVar7 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar7 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",(format_string_checker<char> *)local_238);
      }
      pcVar5 = pcVar7;
    } while (pcVar7 != "");
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)local_238;
    ::fmt::v10::vformat_abi_cxx11_(&local_1a8,(v10 *)0x2143ef,(string_view)ZEXT816(0x1e),args_02);
    local_200._0_4_ = 0xf;
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_1a8._M_dataplus._M_p,
               local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
    goto LAB_00162e0c;
  }
  local_200 = (undefined1  [8])local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"/n/mr","");
  coap::Message::SetUriPath((Error *)local_238,&local_b8,(string *)local_200);
  local_1d8 = local_238._0_4_;
  std::__cxx11::string::operator=((string *)&local_1d0,(string *)&_Stack_230);
  tVar3 = local_1d8;
  if (_Stack_230._M_p != local_228 + 8) {
    operator_delete(_Stack_230._M_p);
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200);
  }
  if (tVar3 != none_type) goto LAB_00162fa0;
  iVar4 = (*(local_1b0->super_Commissioner)._vptr_Commissioner[7])();
  tlv::Tlv::Tlv((Tlv *)local_200,kCommissionerUdpPort,(uint16_t)iVar4,kThread);
  AppendTlv((Error *)local_238,&local_b8,(Tlv *)local_200);
  local_1d8 = local_238._0_4_;
  std::__cxx11::string::operator=((string *)&local_1d0,(string *)&_Stack_230);
  tVar3 = local_1d8;
  if (_Stack_230._M_p != local_228 + 8) {
    operator_delete(_Stack_230._M_p);
  }
  if (local_1f8 != (uchar *)0x0) {
    operator_delete(local_1f8);
  }
  if (tVar3 != none_type) goto LAB_00162fa0;
  tlv::Tlv::Tlv((Tlv *)local_200,kCommissionerSessionId,local_17c,kThread);
  AppendTlv((Error *)local_238,&local_b8,(Tlv *)local_200);
  local_1d8 = local_238._0_4_;
  std::__cxx11::string::operator=((string *)&local_1d0,(string *)&_Stack_230);
  tVar3 = local_1d8;
  if (_Stack_230._M_p != local_228 + 8) {
    operator_delete(_Stack_230._M_p);
  }
  if (local_1f8 != (uchar *)0x0) {
    operator_delete(local_1f8);
  }
  if (tVar3 != none_type) goto LAB_00162fa0;
  tlv::Tlv::Tlv((Tlv *)local_200,kActiveTimestamp,&local_148,kThread);
  AppendTlv((Error *)local_238,&local_b8,(Tlv *)local_200);
  local_1d8 = local_238._0_4_;
  std::__cxx11::string::operator=((string *)&local_1d0,(string *)&_Stack_230);
  tVar3 = local_1d8;
  if (_Stack_230._M_p != local_228 + 8) {
    operator_delete(_Stack_230._M_p);
  }
  if (local_1f8 != (uchar *)0x0) {
    operator_delete(local_1f8);
  }
  if (tVar3 != none_type) goto LAB_00162fa0;
  iVar4 = (*(local_1b0->super_Commissioner)._vptr_Commissioner[10])();
  if ((char)iVar4 != '\0') {
    SignRequest((Error *)local_238,local_1b0,&local_b8,kMeshCoP,true);
    local_1d8 = local_238._0_4_;
    std::__cxx11::string::operator=((string *)&local_1d0,(string *)&_Stack_230);
    tVar3 = local_1d8;
    if (_Stack_230._M_p != local_228 + 8) {
      operator_delete(_Stack_230._M_p);
    }
    if (tVar3 != none_type) goto LAB_00162fa0;
  }
  std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
  function<ot::commissioner::CommissionerImpl::RegisterMulticastListener(std::function<void(unsigned_char_const*,ot::commissioner::Error)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_int)::__0&,void>
            ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
             local_120._M_pod_data,(anon_class_32_1_d0c21527 *)&local_100);
  ProxyClient::SendRequest
            (&local_1b0->mProxyClient,&local_b8,(ResponseHandler *)&local_120,0xfc38,0xf0bf);
  if (local_110 != (code *)0x0) {
    (*local_110)(&local_120,&local_120,__destroy_functor);
  }
  local_238 = (undefined1  [8])local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"mgmt","");
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_1a8;
  ::fmt::v10::vformat_abi_cxx11_
            ((string *)local_200,(v10 *)"sent MLR.req",(string_view)ZEXT816(0xc),args);
  Log(kDebug,(string *)local_238,(string *)local_200);
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200);
  }
  auVar9 = local_238;
  if (local_238 == (undefined1  [8])local_228) goto LAB_00162fa0;
  goto LAB_00162f9b;
}

Assistant:

void CommissionerImpl::RegisterMulticastListener(Handler<uint8_t>                aHandler,
                                                 const std::vector<std::string> &aMulticastAddrList,
                                                 uint32_t                        aTimeout)
{
    Error     error;
    Address   multicastAddr;
    ByteArray rawAddresses;

    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error       error;
        tlv::TlvPtr statusTlv = nullptr;
        uint8_t     status;

        SuccessOrExit(error = aError);

#if OT_COMM_CONFIG_REFERENCE_DEVICE_ENABLE
        LOG_INFO(LOG_REGION_THCI, "received MLR.rsp: {}", utils::Hex(aResponse->GetPayload()));
#endif

        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        statusTlv = GetTlv(tlv::Type::kThreadStatus, *aResponse, tlv::Scope::kThread);
        VerifyOrExit(statusTlv != nullptr, error = ERROR_BAD_FORMAT("no valid State TLV found in response"));

        status = statusTlv->GetValueAsUint8();
        aHandler(&status, error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    VerifyOrExit(!aMulticastAddrList.empty(), error = ERROR_INVALID_ARGS("Multicast Address List cannot be empty"));

    for (const auto &addr : aMulticastAddrList)
    {
        SuccessOrExit(error = multicastAddr.Set(addr));
        VerifyOrExit(multicastAddr.IsIpv6() && multicastAddr.IsMulticast(),
                     error = ERROR_INVALID_ARGS("{} is not a valid IPv6 multicast address", multicastAddr.ToString()));
        rawAddresses.insert(rawAddresses.end(), multicastAddr.GetRaw().begin(), multicastAddr.GetRaw().end());
    }

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kMlr));
    SuccessOrExit(
        error = AppendTlv(request, {tlv::Type::kThreadCommissionerSessionId, GetSessionId(), tlv::Scope::kThread}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kThreadTimeout, aTimeout, tlv::Scope::kThread}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kThreadIpv6Addresses, rawAddresses, tlv::Scope::kThread}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, kPrimaryBbrAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MLR.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}